

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O3

int __thiscall
Superstep<int>::runStep
          (Superstep<int> *this,vector<WorkerThread,_std::allocator<WorkerThread>_> *workers,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *inputVectors,
          vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *outputVectors)

{
  int iVar1;
  runtime_error *this_00;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  type boundedFunction;
  undefined1 local_b1;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *local_b0;
  _Task_state<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dima91[P]BSP_pattern_include_superstep_hpp:178:25)_(unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>)>,_std::allocator<int>,_void_()>
  *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  Barrier *local_98;
  Barrier *local_90;
  vector<WorkerThread,_std::allocator<WorkerThread>_> *local_88;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_80;
  Task local_78;
  packaged_task<void_()> local_68;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dima91[P]BSP_pattern_include_superstep_hpp:178:25)_(unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>)>
  local_50;
  
  uVar4 = (long)(this->activitiesFunctions).
                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->activitiesFunctions).
                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  local_b0 = outputVectors;
  local_88 = workers;
  if ((ulong)((long)(workers->super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(workers->super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 7) < uVar4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Mismatching between number of workers and number of activities! (#workers < #activities)"
              );
  }
  else {
    local_80 = inputVectors;
    if (uVar4 <= (ulong)(((long)(inputVectors->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inputVectors->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555)) {
      local_90 = &this->commPhaseBarrier;
      Barrier::reset(local_90,(int)uVar4);
      Barrier::reset(&this->compPhaseBarrier,
                     (int)((ulong)((long)(this->activitiesFunctions).
                                         super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->activitiesFunctions).
                                        super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6));
      local_98 = &this->startBarrier;
      Barrier::reset(local_98,1);
      if ((this->activitiesFunctions).
          super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->activitiesFunctions).
          super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar3 = 0;
        lVar5 = 0;
        uVar4 = 0;
        do {
          local_50._M_bound_args.
          super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Tuple_impl<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Head_base<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_false>
          ._M_head_impl._M_data =
               (reference_wrapper<std::vector<int,_std::allocator<int>_>_>)
               ((long)&(((local_80->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + lVar3);
          local_50._M_bound_args.
          super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Tuple_impl<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
          ._M_head_impl._M_data =
               (_Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
                )(_Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
                  )local_b0;
          local_a8 = (_Task_state<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dima91[P]BSP_pattern_include_superstep_hpp:178:25)_(unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>)>,_std::allocator<int>,_void_()>
                      *)0x0;
          local_50._M_f.this = this;
          local_50._M_bound_args.
          super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar4;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<std::__future_base::_Task_state<std::_Bind<Superstep<int>::runStep(std::vector<WorkerThread,std::allocator<WorkerThread>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)::_lambda(int,std::vector<int,std::allocator<int>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)_1_(unsigned_long,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>>)>,std::allocator<int>,void()>,std::allocator<int>,std::_Bind<Superstep<int>::runStep(std::vector<WorkerThread,std::allocator<WorkerThread>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)::_lambda(int,std::vector<int,std::allocator<int>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)_1_(unsigned_long,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>>)>&,std::allocator<int>const&>
                    (&_Stack_a0,&local_a8,(allocator<int> *)&local_b1,&local_50,
                     (allocator<int> *)&local_b1);
          local_68._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_68._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = &local_a8->super__Task_state_base<void_()>;
          local_78._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = _Stack_a0._M_pi;
          WorkerThread::assignActivity
                    ((WorkerThread *)
                     ((long)&(((local_88->
                               super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                               _M_impl.super__Vector_impl_data._M_start)->workerThread)._M_id.
                             _M_thread + lVar5),&local_78);
          std::packaged_task<void_()>::~packaged_task(&local_78);
          std::packaged_task<void_()>::~packaged_task(&local_68);
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x80;
          lVar3 = lVar3 + 0x18;
        } while (uVar4 < (ulong)((long)(this->activitiesFunctions).
                                       super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->activitiesFunctions).
                                       super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 6));
      }
      Barrier::decreaseBarrier(local_98);
      Barrier::waitForFinish(local_90);
      if ((this->atExitF).super__Function_base._M_manager != (_Manager_type)0x0) {
        iVar1 = (*(this->atExitF)._M_invoker)((_Any_data *)&this->atExitF,local_b0);
        return iVar1;
      }
      uVar2 = std::__throw_bad_function_call();
      __cxa_free_exception(this);
      _Unwind_Resume(uVar2);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Mismatching between number of activities and number of input queues! (#activities > #queues)"
              );
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Superstep<T>::runStep (std::vector<WorkerThread> &workers,
							std::vector<std::vector<T>>	&inputVectors,
							std::vector<LockableVector<T>> &outputVectors) {

	if (workers.size () < activitiesFunctions.size()) {
		throw std::runtime_error ("Mismatching between number of workers and number of activities! (#workers < #activities)");
	}
	if (inputVectors.size() < activitiesFunctions.size())
		throw std::runtime_error ("Mismatching between number of activities and number of input queues! (#activities > #queues)");

	// Resetting bariers
	commPhaseBarrier.reset (activitiesFunctions.size());
	compPhaseBarrier.reset (activitiesFunctions.size());
	startBarrier.reset (1);


	// Setting up worker threads
	for (size_t i=0; i<activitiesFunctions.size(); i++) {
		// Binding packaged task to arguments
		auto lambdaFunction	= [&] (int index, std::vector<T> &inputItems, std::vector<LockableVector<T>> &outputItems) {
			workerFunction (index, inputItems, outputItems);
		};
		auto boundedFunction	= std::bind (lambdaFunction, i, std::ref(inputVectors[i]), std::ref(outputVectors));
		auto packagedTask		= std::packaged_task<void()> (boundedFunction);

		// Assigning created packaged_task to a worker
		workers[i].assignActivity (std::move(packagedTask));
	}

	// Starting workers and waiting for their completion
	startBarrier.decreaseBarrier ();
	commPhaseBarrier.waitForFinish ();
	
	return atExitF (outputVectors);
}